

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O2

void __thiscall CTcMake::get_srcfile(CTcMake *this,textchar_t *dst,CTcMakeModule *mod)

{
  CTcMakePath *pCVar1;
  int iVar2;
  textchar_t *ptVar3;
  textchar_t *ptVar4;
  CTcMakePath **ppCVar5;
  
  ptVar3 = CTcMakeModule::get_search_source_name(mod);
  iVar2 = os_is_file_absolute(ptVar3);
  ptVar3 = (mod->src_).buf_;
  if (ptVar3 == (textchar_t *)0x0) {
    ptVar3 = "";
  }
  if (iVar2 == 0) {
    iVar2 = access(ptVar3,0);
    if (iVar2 != 0) {
      ppCVar5 = &this->src_head_;
      while (pCVar1 = *ppCVar5, pCVar1 != (CTcMakePath *)0x0) {
        ptVar3 = (pCVar1->path_).buf_;
        if (ptVar3 == (textchar_t *)0x0) {
          ptVar3 = "";
        }
        ptVar4 = CTcMakeModule::get_search_source_name(mod);
        os_build_full_path(dst,0x1000,ptVar3,ptVar4);
        iVar2 = access(dst,0);
        ppCVar5 = &pCVar1->nxt_;
        if (iVar2 == 0) {
          return;
        }
      }
    }
    ptVar4 = (mod->src_).buf_;
    ptVar3 = "";
    if (ptVar4 != (textchar_t *)0x0) {
      ptVar3 = ptVar4;
    }
  }
  lib_strcpy(dst,0x1000,ptVar3);
  return;
}

Assistant:

void CTcMake::get_srcfile(textchar_t *dst, CTcMakeModule *mod)
{
    CTcMakePath *path;
    
    /* 
     *   if the file has an absolute path already, use the name without
     *   further modification; otherwise, apply our default path 
     */
    if (os_is_file_absolute(mod->get_search_source_name()))
    {
        /* it's absolute - ignore the search path */
        lib_strcpy(dst, OSFNMAX, mod->get_source_name());
        return;
    }

    /*
     *   If the file exists with the name as given (in other words, relative
     *   to the current working directory), use the name as given. 
     */
    if (!osfacc(mod->get_source_name()))
    {
        /* the file exists in the current directory - use the name as given */
        lib_strcpy(dst, OSFNMAX, mod->get_source_name());
        return;
    }

    /* search the source path for the file */
    for (path = src_head_ ; path != 0 ; path = path->get_next())
    {
        /* build the full path for this source path */
        os_build_full_path(dst, OSFNMAX, path->get_path(),
                           mod->get_search_source_name());

        /* if the resulting file exists, return it */
        if (!osfacc(dst))
            return;
    }

    /* 
     *   we failed to find the file anywhere - return the name as given,
     *   which will let the caller fail when it can't open the file 
     */
    lib_strcpy(dst, OSFNMAX, mod->get_source_name());
}